

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<float>::Subst_Diag(TPZMatrix<float> *this,TPZFMatrix<float> *B)

{
  long lVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  float extraout_XMM0_Da;
  int64_t c;
  float pivot;
  int64_t r;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  float local_2c;
  long local_28;
  float local_1c;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if (iVar3 != lVar4) {
    Error(in_stack_000001a0,in_stack_00000198);
  }
  local_18 = 0;
  while( true ) {
    lVar4 = local_18;
    lVar5 = (**(code **)(*in_RDI + 0x60))();
    if (lVar5 <= lVar4) break;
    local_1c = (float)(**(code **)(*in_RDI + 0x120))(in_RDI,local_18,local_18);
    local_28 = 0;
    while( true ) {
      lVar4 = local_28;
      iVar3 = TPZBaseMatrix::Cols(local_10);
      pTVar2 = local_10;
      lVar1 = local_18;
      lVar5 = local_28;
      if (iVar3 <= lVar4) break;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_18,local_28);
      local_2c = extraout_XMM0_Da / local_1c;
      (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar1,lVar5,&local_2c);
      local_28 = local_28 + 1;
    }
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}